

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlValidateQName(xmlChar *value,int space)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  bool bVar4;
  uint local_4c;
  uint local_44;
  int local_30;
  uint local_2c;
  int l;
  int c;
  xmlChar *cur;
  xmlChar *pxStack_18;
  int space_local;
  xmlChar *value_local;
  
  if (value == (xmlChar *)0x0) {
    return -1;
  }
  _l = value;
  if (space != 0) {
    while( true ) {
      bVar4 = true;
      if ((*_l != 0x20) && ((*_l < 9 || (bVar4 = true, 10 < *_l)))) {
        bVar4 = *_l == 0xd;
      }
      if (!bVar4) break;
      _l = _l + 1;
    }
  }
  if ((((0x60 < *_l) && (*_l < 0x7b)) || ((0x40 < *_l && (*_l < 0x5b)))) || (*_l == 0x5f)) {
    do {
      pbVar1 = _l;
      _l = pbVar1 + 1;
      if (((*_l < 0x61) || (bVar4 = true, 0x7a < *_l)) &&
         (((*_l < 0x41 || (bVar4 = true, 0x5a < *_l)) &&
          ((((*_l < 0x30 || (bVar4 = true, 0x39 < *_l)) && (bVar4 = true, *_l != 0x5f)) &&
           (bVar4 = true, *_l != 0x2d)))))) {
        bVar4 = *_l == 0x2e;
      }
    } while (bVar4);
    if (*_l == 0x3a) {
      pbVar3 = pbVar1 + 2;
      if ((((*pbVar3 < 0x61) || (0x7a < *pbVar3)) && ((*pbVar3 < 0x41 || (0x5a < *pbVar3)))) &&
         (*pbVar3 != 0x5f)) goto LAB_0015f470;
      _l = pbVar1 + 3;
      while( true ) {
        if (((*_l < 0x61) || (bVar4 = true, 0x7a < *_l)) &&
           (((*_l < 0x41 || (bVar4 = true, 0x5a < *_l)) &&
            ((((*_l < 0x30 || (bVar4 = true, 0x39 < *_l)) && (bVar4 = true, *_l != 0x5f)) &&
             (bVar4 = true, *_l != 0x2d)))))) {
          bVar4 = *_l == 0x2e;
        }
        if (!bVar4) break;
        _l = _l + 1;
      }
    }
    if (space != 0) {
      while( true ) {
        bVar4 = true;
        if ((*_l != 0x20) && ((*_l < 9 || (bVar4 = true, 10 < *_l)))) {
          bVar4 = *_l == 0xd;
        }
        if (!bVar4) break;
        _l = _l + 1;
      }
    }
    if (*_l == 0) {
      return 0;
    }
  }
LAB_0015f470:
  _l = value;
  cur._4_4_ = space;
  pxStack_18 = value;
  local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&local_30);
  if (cur._4_4_ != 0) {
    while( true ) {
      if ((int)local_2c < 0x100) {
        bVar4 = true;
        if ((local_2c != 0x20) && (((int)local_2c < 9 || (bVar4 = true, 10 < (int)local_2c)))) {
          bVar4 = local_2c == 0xd;
        }
      }
      else {
        bVar4 = false;
      }
      if (!bVar4) break;
      _l = _l + local_30;
      local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
    }
  }
  if ((int)local_2c < 0x100) {
    if ((((0x40 < (int)local_2c) && ((int)local_2c < 0x5b)) ||
        ((0x60 < (int)local_2c && ((int)local_2c < 0x7b)))) ||
       ((((0xbf < (int)local_2c && ((int)local_2c < 0xd7)) ||
         ((0xd7 < (int)local_2c && ((int)local_2c < 0xf7)))) || (0xf7 < (int)local_2c))))
    goto LAB_0015f5d9;
  }
  else {
    iVar2 = xmlCharInRange(local_2c,&xmlIsBaseCharGroup);
    if (iVar2 != 0) goto LAB_0015f5d9;
  }
  if ((((int)local_2c < 0x100) ||
      (((((int)local_2c < 0x4e00 || (0x9fa5 < (int)local_2c)) && (local_2c != 0x3007)) &&
       (((int)local_2c < 0x3021 || (0x3029 < (int)local_2c)))))) && (local_2c != 0x5f)) {
    return 1;
  }
LAB_0015f5d9:
  _l = _l + local_30;
  local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
  do {
    if ((int)local_2c < 0x100) {
      if (((((((int)local_2c < 0x41) || (bVar4 = true, 0x5a < (int)local_2c)) &&
            (((int)local_2c < 0x61 || (bVar4 = true, 0x7a < (int)local_2c)))) &&
           (((int)local_2c < 0xc0 || (bVar4 = true, 0xd6 < (int)local_2c)))) &&
          (((int)local_2c < 0xd8 || (bVar4 = true, 0xf6 < (int)local_2c)))) &&
         (bVar4 = true, (int)local_2c < 0xf8)) {
LAB_0015f6a5:
        if (((int)local_2c < 0x100) ||
           (((((int)local_2c < 0x4e00 || (bVar4 = true, 0x9fa5 < (int)local_2c)) &&
             (bVar4 = true, local_2c != 0x3007)) &&
            (((int)local_2c < 0x3021 || (bVar4 = true, 0x3029 < (int)local_2c)))))) {
          if ((int)local_2c < 0x100) {
            if (((int)local_2c < 0x30) || (bVar4 = true, 0x39 < (int)local_2c)) {
LAB_0015f74d:
              bVar4 = true;
              if ((local_2c != 0x2e) &&
                 ((bVar4 = true, local_2c != 0x2d && (bVar4 = true, local_2c != 0x5f)))) {
                if (0xff < (int)local_2c) {
                  iVar2 = xmlCharInRange(local_2c,&xmlIsCombiningGroup);
                  bVar4 = true;
                  if (iVar2 != 0) goto LAB_0015f7df;
                }
                if ((int)local_2c < 0x100) {
                  local_44 = (uint)(local_2c == 0xb7);
                }
                else {
                  local_44 = xmlCharInRange(local_2c,&xmlIsExtenderGroup);
                }
                bVar4 = local_44 != 0;
              }
            }
          }
          else {
            iVar2 = xmlCharInRange(local_2c,&xmlIsDigitGroup);
            bVar4 = true;
            if (iVar2 == 0) goto LAB_0015f74d;
          }
        }
      }
    }
    else {
      iVar2 = xmlCharInRange(local_2c,&xmlIsBaseCharGroup);
      bVar4 = true;
      if (iVar2 == 0) goto LAB_0015f6a5;
    }
LAB_0015f7df:
    if (!bVar4) break;
    _l = _l + local_30;
    local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
  } while( true );
  if (local_2c != 0x3a) {
LAB_0015fb49:
    if (cur._4_4_ != 0) {
      while( true ) {
        if ((int)local_2c < 0x100) {
          bVar4 = true;
          if ((local_2c != 0x20) && (((int)local_2c < 9 || (bVar4 = true, 10 < (int)local_2c)))) {
            bVar4 = local_2c == 0xd;
          }
        }
        else {
          bVar4 = false;
        }
        if (!bVar4) break;
        _l = _l + local_30;
        local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
      }
    }
    if (local_2c != 0) {
      return 1;
    }
    return 0;
  }
  _l = _l + local_30;
  local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
  if ((int)local_2c < 0x100) {
    if ((((0x40 < (int)local_2c) && ((int)local_2c < 0x5b)) ||
        ((0x60 < (int)local_2c && ((int)local_2c < 0x7b)))) ||
       ((((0xbf < (int)local_2c && ((int)local_2c < 0xd7)) ||
         ((0xd7 < (int)local_2c && ((int)local_2c < 0xf7)))) || (0xf7 < (int)local_2c))))
    goto LAB_0015f90e;
  }
  else {
    iVar2 = xmlCharInRange(local_2c,&xmlIsBaseCharGroup);
    if (iVar2 != 0) goto LAB_0015f90e;
  }
  if ((((int)local_2c < 0x100) ||
      (((((int)local_2c < 0x4e00 || (0x9fa5 < (int)local_2c)) && (local_2c != 0x3007)) &&
       (((int)local_2c < 0x3021 || (0x3029 < (int)local_2c)))))) && (local_2c != 0x5f)) {
    return 1;
  }
LAB_0015f90e:
  _l = _l + local_30;
  local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
  do {
    if ((int)local_2c < 0x100) {
      if ((((((int)local_2c < 0x41) || (bVar4 = true, 0x5a < (int)local_2c)) &&
           (((int)local_2c < 0x61 || (bVar4 = true, 0x7a < (int)local_2c)))) &&
          ((((int)local_2c < 0xc0 || (bVar4 = true, 0xd6 < (int)local_2c)) &&
           (((int)local_2c < 0xd8 || (bVar4 = true, 0xf6 < (int)local_2c)))))) &&
         (bVar4 = true, (int)local_2c < 0xf8)) {
LAB_0015f9da:
        if (((int)local_2c < 0x100) ||
           (((((int)local_2c < 0x4e00 || (bVar4 = true, 0x9fa5 < (int)local_2c)) &&
             (bVar4 = true, local_2c != 0x3007)) &&
            (((int)local_2c < 0x3021 || (bVar4 = true, 0x3029 < (int)local_2c)))))) {
          if ((int)local_2c < 0x100) {
            if (((int)local_2c < 0x30) || (bVar4 = true, 0x39 < (int)local_2c)) {
LAB_0015fa82:
              bVar4 = true;
              if ((local_2c != 0x2e) &&
                 ((bVar4 = true, local_2c != 0x2d && (bVar4 = true, local_2c != 0x5f)))) {
                if (0xff < (int)local_2c) {
                  iVar2 = xmlCharInRange(local_2c,&xmlIsCombiningGroup);
                  bVar4 = true;
                  if (iVar2 != 0) goto LAB_0015fb14;
                }
                if ((int)local_2c < 0x100) {
                  local_4c = (uint)(local_2c == 0xb7);
                }
                else {
                  local_4c = xmlCharInRange(local_2c,&xmlIsExtenderGroup);
                }
                bVar4 = local_4c != 0;
              }
            }
          }
          else {
            iVar2 = xmlCharInRange(local_2c,&xmlIsDigitGroup);
            bVar4 = true;
            if (iVar2 == 0) goto LAB_0015fa82;
          }
        }
      }
    }
    else {
      iVar2 = xmlCharInRange(local_2c,&xmlIsBaseCharGroup);
      bVar4 = true;
      if (iVar2 == 0) goto LAB_0015f9da;
    }
LAB_0015fb14:
    if (!bVar4) goto LAB_0015fb49;
    _l = _l + local_30;
    local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
  } while( true );
}

Assistant:

int
xmlValidateQName(const xmlChar *value, int space) {
    const xmlChar *cur = value;
    int c,l;

    if (value == NULL)
        return(-1);
    /*
     * First quick algorithm for ASCII range
     */
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (((*cur >= 'a') && (*cur <= 'z')) || ((*cur >= 'A') && (*cur <= 'Z')) ||
	(*cur == '_'))
	cur++;
    else
	goto try_complex;
    while (((*cur >= 'a') && (*cur <= 'z')) ||
	   ((*cur >= 'A') && (*cur <= 'Z')) ||
	   ((*cur >= '0') && (*cur <= '9')) ||
	   (*cur == '_') || (*cur == '-') || (*cur == '.'))
	cur++;
    if (*cur == ':') {
	cur++;
	if (((*cur >= 'a') && (*cur <= 'z')) ||
	    ((*cur >= 'A') && (*cur <= 'Z')) ||
	    (*cur == '_'))
	    cur++;
	else
	    goto try_complex;
	while (((*cur >= 'a') && (*cur <= 'z')) ||
	       ((*cur >= 'A') && (*cur <= 'Z')) ||
	       ((*cur >= '0') && (*cur <= '9')) ||
	       (*cur == '_') || (*cur == '-') || (*cur == '.'))
	    cur++;
    }
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (*cur == 0)
	return(0);

try_complex:
    /*
     * Second check for chars outside the ASCII range
     */
    cur = value;
    c = CUR_SCHAR(cur, l);
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if ((!IS_LETTER(c)) && (c != '_'))
	return(1);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (IS_LETTER(c) || IS_DIGIT(c) || (c == '.') ||
	   (c == '-') || (c == '_') || IS_COMBINING(c) ||
	   IS_EXTENDER(c)) {
	cur += l;
	c = CUR_SCHAR(cur, l);
    }
    if (c == ':') {
	cur += l;
	c = CUR_SCHAR(cur, l);
	if ((!IS_LETTER(c)) && (c != '_'))
	    return(1);
	cur += l;
	c = CUR_SCHAR(cur, l);
	while (IS_LETTER(c) || IS_DIGIT(c) || (c == '.') ||
	       (c == '-') || (c == '_') || IS_COMBINING(c) ||
	       IS_EXTENDER(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if (c != 0)
	return(1);
    return(0);
}